

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void rotate_matrix(float angle,float x,float y,float z,float *r)

{
  undefined1 auVar1 [16];
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float u [3];
  float local_2c [3];
  
  fVar9 = (angle * 3.1415927) / 180.0;
  fVar10 = (float)SDL_cosf();
  fVar11 = (float)SDL_sinf(fVar9);
  fVar9 = (float)SDL_cosf(fVar9);
  dVar2 = (double)SDL_sqrt(SUB84((double)(x * x + y * y),0));
  fVar12 = (float)dVar2;
  local_2c[0] = x / fVar12;
  local_2c[1] = y / fVar12;
  local_2c[2] = 0.0 / fVar12;
  r[0xc] = 0.0;
  r[0xd] = 0.0;
  r[0xe] = 0.0;
  r[0xf] = 0.0;
  r[0] = 0.0;
  r[1] = 0.0;
  r[2] = 0.0;
  r[3] = 0.0;
  r[4] = 0.0;
  r[5] = 0.0;
  r[6] = 0.0;
  r[7] = 0.0;
  r[8] = 0.0;
  r[9] = 0.0;
  r[10] = 0.0;
  r[0xb] = 0.0;
  r[0xf] = 1.0;
  uVar6 = 1;
  iVar7 = 2;
  uVar4 = 2;
  lVar8 = 0;
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar4;
    uVar3 = (ulong)uVar6;
    if ((int)lVar8 == 8) {
      uVar3 = 0;
    }
    r[lVar8 + uVar3] =
         *(float *)((long)local_2c +
                   lVar8 + (SUB168(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffcU
                           ) * -3 + 8) * fVar11;
    r[(uint)(iVar7 + (int)((uVar4 & 0xffffffff) / 3) * -3)] = -local_2c[uVar3] * fVar11;
    lVar8 = lVar8 + 4;
    uVar6 = uVar6 + 1;
    iVar7 = iVar7 + 5;
    uVar4 = uVar4 + 1;
  } while ((int)lVar8 != 0xc);
  lVar8 = 0;
  do {
    fVar11 = local_2c[lVar8];
    lVar5 = 0;
    do {
      fVar12 = fVar10;
      if (lVar8 != lVar5) {
        fVar12 = 0.0;
      }
      r[lVar5] = local_2c[lVar5] * fVar11 * (1.0 - fVar9) + fVar12 + r[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar8 = lVar8 + 1;
    r = r + 4;
  } while (lVar8 != 3);
  return;
}

Assistant:

static void
rotate_matrix(float angle, float x, float y, float z, float *r)
{
    float radians, c, s, c1, u[3], length;
    int i, j;

    radians = (float)(angle * M_PI) / 180.0f;

    c = SDL_cosf(radians);
    s = SDL_sinf(radians);

    c1 = 1.0f - SDL_cosf(radians);

    length = (float)SDL_sqrt(x * x + y * y + z * z);

    u[0] = x / length;
    u[1] = y / length;
    u[2] = z / length;

    for (i = 0; i < 16; i++) {
        r[i] = 0.0;
    }

    r[15] = 1.0;

    for (i = 0; i < 3; i++) {
        r[i * 4 + (i + 1) % 3] = u[(i + 2) % 3] * s;
        r[i * 4 + (i + 2) % 3] = -u[(i + 1) % 3] * s;
    }

    for (i = 0; i < 3; i++) {
        for (j = 0; j < 3; j++) {
            r[i * 4 + j] += c1 * u[i] * u[j] + (i == j ? c : 0.0f);
        }
    }
}